

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command.cpp
# Opt level: O2

char * svariable(char *name,char *cur,char **storage,identfun fun,int flags)

{
  char *pcVar1;
  ident local_48;
  
  local_48.type = 2;
  local_48.name = name;
  local_48.field_4 = (anon_union_8_3_558327c1_for_ident_6)storage;
  local_48.fun = fun;
  local_48.flags = flags;
  addident(&local_48);
  pcVar1 = newstring(cur);
  return pcVar1;
}

Assistant:

char *svariable(const char *name, const char *cur, char **storage, identfun fun, int flags)
{
    addident(ident(ID_SVAR, name, storage, (void *)fun, flags));
    return newstring(cur);
}